

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_get_diagonal_block
               (Integer g_a,void *ptr,Integer g_v,Integer *loA,Integer *hiA,Integer ld,Integer type)

{
  Integer *pIVar1;
  Integer *pIVar2;
  Integer IVar3;
  void *__ptr;
  Integer *pIVar4;
  long *in_RCX;
  long in_RSI;
  long *in_R8;
  long in_R9;
  Integer in_stack_00000008;
  SingleComplex *fca;
  DoubleComplex *dca;
  long *la;
  double *da;
  float *fa;
  int *ia;
  void *buf;
  Integer i;
  Integer hi [2];
  Integer lo [2];
  Integer jhiA;
  Integer jloA;
  Integer ihiA;
  Integer iloA;
  Integer vhi;
  Integer vlo;
  Integer size;
  Integer nelem;
  Integer *buf_00;
  Integer *hi_00;
  Integer *pIVar5;
  Integer *lo_00;
  Integer *g_a_00;
  Integer *local_e8;
  undefined4 *local_d8;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  long local_a0;
  
  pIVar1 = (Integer *)*in_RCX;
  pIVar4 = (Integer *)*in_R8;
  pIVar2 = (Integer *)in_RCX[1];
  buf_00 = (Integer *)in_R8[1];
  if (0 < (long)pIVar1) {
    local_e8 = pIVar2;
    if ((long)pIVar2 <= (long)pIVar1) {
      local_e8 = pIVar1;
    }
    pIVar5 = buf_00;
    if ((long)pIVar4 <= (long)buf_00) {
      pIVar5 = pIVar4;
    }
    if ((long)local_e8 <= (long)pIVar5) {
      lo_00 = pIVar5;
      g_a_00 = pIVar5;
      IVar3 = GAsizeof(in_stack_00000008);
      hi_00 = pIVar2;
      if ((long)pIVar2 <= (long)pIVar1) {
        hi_00 = pIVar1;
      }
      if ((long)pIVar4 <= (long)buf_00) {
        buf_00 = pIVar4;
      }
      __ptr = malloc(((long)buf_00 + (1 - (long)hi_00)) * IVar3);
      if (__ptr == (void *)0x0) {
        pnga_error((char *)lo[0],hi[1]);
      }
      pIVar4 = (Integer *)(in_stack_00000008 + -0x3e9);
      switch(pIVar4) {
      case (Integer *)0x0:
        local_b0 = (undefined4 *)
                   (((long)local_e8 + (in_R9 * ((long)local_e8 - (long)pIVar2) - (long)pIVar1)) * 4
                   + in_RSI);
        for (local_a0 = 0; local_a0 < (long)pIVar5 + (1 - (long)local_e8); local_a0 = local_a0 + 1)
        {
          *(undefined4 *)((long)__ptr + local_a0 * 4) = *local_b0;
          local_b0 = local_b0 + in_R9 + 1;
        }
        break;
      case (Integer *)0x1:
        local_c8 = (undefined8 *)
                   (((long)local_e8 + (in_R9 * ((long)local_e8 - (long)pIVar2) - (long)pIVar1)) * 8
                   + in_RSI);
        for (local_a0 = 0; local_a0 < (long)pIVar5 + (1 - (long)local_e8); local_a0 = local_a0 + 1)
        {
          *(undefined8 *)((long)__ptr + local_a0 * 8) = *local_c8;
          local_c8 = local_c8 + in_R9 + 1;
        }
        break;
      case (Integer *)0x2:
        local_b8 = (undefined4 *)
                   (((long)local_e8 + (in_R9 * ((long)local_e8 - (long)pIVar2) - (long)pIVar1)) * 4
                   + in_RSI);
        for (local_a0 = 0; local_a0 < (long)pIVar5 + (1 - (long)local_e8); local_a0 = local_a0 + 1)
        {
          *(undefined4 *)((long)__ptr + local_a0 * 4) = *local_b8;
          local_b8 = local_b8 + in_R9 + 1;
        }
        break;
      case (Integer *)0x3:
        local_c0 = (undefined8 *)
                   (((long)local_e8 + (in_R9 * ((long)local_e8 - (long)pIVar2) - (long)pIVar1)) * 8
                   + in_RSI);
        for (local_a0 = 0; local_a0 < (long)pIVar5 + (1 - (long)local_e8); local_a0 = local_a0 + 1)
        {
          *(undefined8 *)((long)__ptr + local_a0 * 8) = *local_c0;
          local_c0 = local_c0 + in_R9 + 1;
        }
        break;
      default:
        pnga_error((char *)lo[0],hi[1]);
        break;
      case (Integer *)0x5:
        local_d8 = (undefined4 *)
                   (((long)local_e8 + (in_R9 * ((long)local_e8 - (long)pIVar2) - (long)pIVar1)) * 8
                   + in_RSI);
        for (local_a0 = 0; local_a0 < (long)pIVar5 + (1 - (long)local_e8); local_a0 = local_a0 + 1)
        {
          *(undefined4 *)((long)__ptr + local_a0 * 8) = *local_d8;
          *(undefined4 *)((long)__ptr + local_a0 * 8 + 4) = local_d8[1];
          local_d8 = local_d8 + (in_R9 + 1) * 2;
        }
        break;
      case (Integer *)0x6:
        local_d0 = (undefined8 *)
                   (((long)local_e8 + (in_R9 * ((long)local_e8 - (long)pIVar2) - (long)pIVar1)) *
                    0x10 + in_RSI);
        for (local_a0 = 0; local_a0 < (long)pIVar5 + (1 - (long)local_e8); local_a0 = local_a0 + 1)
        {
          *(undefined8 *)((long)__ptr + local_a0 * 0x10) = *local_d0;
          *(undefined8 *)((long)__ptr + local_a0 * 0x10 + 8) = local_d0[1];
          local_d0 = local_d0 + (in_R9 + 1) * 2;
        }
      }
      pnga_put((Integer)g_a_00,lo_00,hi_00,buf_00,pIVar4);
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void sgai_get_diagonal_block(Integer g_a, void *ptr, Integer g_v,
                            Integer *loA, Integer *hiA, Integer ld,
                            Integer type)
{
  Integer nelem, size;
  Integer vlo, vhi, iloA, ihiA, jloA, jhiA, lo[2], hi[2];
  Integer i;
  void *buf;
  int *ia;
  float *fa;
  double *da;
  long *la;
  DoubleComplex *dca;
  SingleComplex *fca;

  iloA = loA[0];
  ihiA = hiA[0];
  jloA = loA[1];
  jhiA = hiA[1];

  /* determine subset of my patch to access */
  if (iloA > 0)
  {
    lo[0] = GA_MAX (iloA, jloA);
    lo[1] = GA_MAX (iloA, jloA);
    hi[0] = GA_MIN (ihiA, jhiA);
    hi[1] = GA_MIN (ihiA, jhiA);



    if (hi[0] >= lo[0]) /*make sure the equality symbol is there!!! */
    {                   /* we got a block containing diagonal elements */

      /*allocate a buffer for the given vector g_v */
      size = GAsizeof (type);
      vlo = GA_MAX (iloA, jloA);
      vhi = GA_MIN (ihiA, jhiA);
      nelem = vhi - vlo + 1;
      buf = malloc (nelem * size);
      if (buf == NULL)
        pnga_error
          ("ga_get_diag_:failed to allocate memory for the local buffer.",
           9999);

      /* get the vector from the global array g_a, put that in the the local memory buffer buf */
      switch (type)
      {
        case C_INT:
          ia = (int *) ptr;
          ia += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            ((int *) buf)[i] = *ia;
            ia += ld + 1;
          }
          break;
        case C_LONG:
          la = (long *) ptr;
          la += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            ((long *) buf)[i] = *la;
            la += ld + 1;
          }
          break;
        case C_FLOAT:
          fa = (float *) ptr;
          fa += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            ((float *) buf)[i] = *fa;
            fa += ld + 1;
          }
          break;
        case C_DBL:
          da = (double *) ptr;
          da += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            ((double *) buf)[i] = *da;
            da += ld + 1;
          }
          break;
        case C_DCPL:
          dca = (DoubleComplex *) ptr;
          dca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (((DoubleComplex *) buf)[i]).real = (*dca).real;
            (((DoubleComplex *) buf)[i]).imag = (*dca).imag;
            dca += ld + 1;
          }
          break;

        case C_SCPL:
          fca = (SingleComplex *) ptr;
          fca += ld*(lo[1]-jloA) + lo[0]-iloA;
          for (i = 0; i < hi[0] - lo[0] + 1; i++)
          {
            (((SingleComplex *) buf)[i]).real = (*fca).real;
            (((SingleComplex *) buf)[i]).imag = (*fca).imag;
            fca += ld + 1;
          }
          break;

        default:
          pnga_error("get_diagonal_zero: wrong data type:", type);
      }

      /* copy the local memory buffer buf to g_v */
      pnga_put(g_v, &vlo, &vhi, buf, &vhi);

      /*free the memory */
      free (buf);
    }
  }
}